

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void Z80::InitNextExtensions(void)

{
  if ((DAT_0018d51c != 0) && (InitNextExtensions()::nextWasInitialized == '\0')) {
    InitNextExtensions()::nextWasInitialized = 1;
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"brlc",OpCode_Next_BRLC);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"bsla",OpCode_Next_BSLA);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"bsra",OpCode_Next_BSRA);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"bsrf",OpCode_Next_BSRF);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"bsrl",OpCode_Next_BSRL);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"lddrx",OpCode_Next_LDDRX);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"lddx",OpCode_Next_LDDX);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"ldirx",OpCode_Next_LDIRX);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"ldix",OpCode_Next_LDIX);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"ldpirx",OpCode_Next_LDPIRX);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"ldws",OpCode_Next_LDWS);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"mirror",OpCode_Next_MIRROR);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"mul",OpCode_Next_MUL);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"nextreg",OpCode_Next_NEXTREG);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"outinb",OpCode_Next_OUTINB);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"pixelad",OpCode_Next_PIXELAD);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"pixeldn",OpCode_Next_PIXELDN);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"setae",OpCode_Next_SETAE);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"swapnib",OpCode_Next_SWAPNIB);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"test",OpCode_Next_TEST);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"exit",OpCode_Next_EXIT);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"break",OpCode_Next_BREAK);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"setbrk",OpCode_Next_SETBRK);
    CFunctionTable::Insert((CFunctionTable *)OpCodeTable,"clrbrk",OpCode_Next_CLRBRK);
    return;
  }
  return;
}

Assistant:

void InitNextExtensions() {
		static bool nextWasInitialized = false;
		if (!Options::syx.IsNextEnabled || nextWasInitialized) return;
		nextWasInitialized = true;
		// Next extended opcodes
		OpCodeTable.Insert("brlc",		OpCode_Next_BRLC);
		OpCodeTable.Insert("bsla",		OpCode_Next_BSLA);
		OpCodeTable.Insert("bsra",		OpCode_Next_BSRA);
		OpCodeTable.Insert("bsrf",		OpCode_Next_BSRF);
		OpCodeTable.Insert("bsrl",		OpCode_Next_BSRL);
		OpCodeTable.Insert("lddrx",		OpCode_Next_LDDRX);
		OpCodeTable.Insert("lddx",		OpCode_Next_LDDX);
		//OpCodeTable.Insert("ldirscale",	OpCode_Next_LDIRSCALE);
		OpCodeTable.Insert("ldirx",		OpCode_Next_LDIRX);
		OpCodeTable.Insert("ldix",		OpCode_Next_LDIX);
		OpCodeTable.Insert("ldpirx",	OpCode_Next_LDPIRX);
		OpCodeTable.Insert("ldws",		OpCode_Next_LDWS);
		OpCodeTable.Insert("mirror",	OpCode_Next_MIRROR);
		OpCodeTable.Insert("mul",		OpCode_Next_MUL);
		OpCodeTable.Insert("nextreg",	OpCode_Next_NEXTREG);
		OpCodeTable.Insert("outinb",	OpCode_Next_OUTINB);
		OpCodeTable.Insert("pixelad",	OpCode_Next_PIXELAD);
		OpCodeTable.Insert("pixeldn",	OpCode_Next_PIXELDN);
		OpCodeTable.Insert("setae",		OpCode_Next_SETAE);
		OpCodeTable.Insert("swapnib",	OpCode_Next_SWAPNIB);
		OpCodeTable.Insert("test",		OpCode_Next_TEST);
		// CSpect emulator extensions, fake instructions "exit" and "break"
		OpCodeTable.Insert("exit",		OpCode_Next_EXIT);
		OpCodeTable.Insert("break",		OpCode_Next_BREAK);
		OpCodeTable.Insert("setbrk",	OpCode_Next_SETBRK);
		OpCodeTable.Insert("clrbrk",	OpCode_Next_CLRBRK);
	}